

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::ProcessGetData
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,atomic<bool> *interruptMsgProc)

{
  pointer *ppuVar1;
  int iVar2;
  uint uVar3;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
  *this_00;
  CBlockIndex *pCVar4;
  uint256 *puVar5;
  CConnman *this_01;
  pointer ppCVar6;
  size_type sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  string_view source_file;
  iterator __first;
  string msg_type;
  iterator __last;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  base_blob<256U> *pbVar12;
  element_type *block;
  bool bVar13;
  bool bVar14;
  TxRelay *pTVar15;
  const_iterator cVar16;
  uchar *puVar17;
  CBlockIndex *pCVar18;
  Logger *pLVar19;
  Chainstate *pCVar20;
  undefined7 extraout_var;
  uint64_t nonce;
  mutex_type *pmVar21;
  long *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Base_ptr this_02;
  ulong uVar24;
  pointer ppVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_06;
  string_view str;
  string_view logging_function_06;
  CBlockIndex *in_stack_fffffffffffffca8;
  Peer *pPVar32;
  PeerManagerImpl *pPVar33;
  _Elt_pointer hash;
  _Map_pointer ppCVar34;
  char in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce1;
  vector<CInv,_std::allocator<CInv>_> vNotFound;
  GetDataMsg local_2fc;
  vector<CInv,_std::allocator<CInv>_> vInv;
  shared_ptr<const_CBlock> pblock;
  FlatFilePos block_pos;
  element_type *local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  shared_ptr<const_CBlockHeaderAndShortTxIDs> a_recent_compact_block;
  shared_ptr<const_CBlock> a_recent_block;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  string local_278;
  string local_258;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock53;
  undefined1 local_228 [16];
  TransactionSerParams maybe_with_witness;
  undefined1 auStack_217 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [11];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock51;
  CInv *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  undefined1 auStack_130 [8];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  CPartialMerkleTree local_108;
  undefined1 local_b8 [16];
  pointer local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  undefined1 local_78 [20];
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined6 uStack_60;
  uchar local_5a [2];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar15 = Peer::GetTxRelay(peer);
  paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
  hash = (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
  ppCVar34 = (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (paVar22 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur) {
    in_stack_fffffffffffffca8 = (CBlockIndex *)&this->m_most_recent_block_mutex;
    paVar23 = paVar22;
    do {
      iVar2 = *(int *)paVar23;
      paVar22 = paVar23;
      if (((iVar2 != 1) && (iVar2 != 0x40000001)) && (iVar2 != 5)) break;
      if ((((__int_type_conflict)interruptMsgProc->_M_base)._M_i & 1U) != 0) goto LAB_001e0db5;
      if (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0) break;
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar23 + 0x24);
      if (paVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)hash) {
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)ppCVar34[1];
        ppCVar34 = ppCVar34 + 1;
        hash = (_Elt_pointer)((long)paVar22 + 0x1f8);
      }
      if (pTVar15 != (TxRelay *)0x0) {
        ToGenTxid((GenTxid *)&maybe_with_witness,(CInv *)paVar23);
        CTxMemPool::info_for_relay
                  ((TxMempoolInfo *)&criticalblock51,this->m_mempool,(GenTxid *)&maybe_with_witness,
                   pTVar15->m_last_inv_sequence);
        pmVar21 = criticalblock51.super_unique_lock._M_device;
        if (criticalblock51.super_unique_lock._M_device == (mutex_type *)0x0) {
          local_58[8] = false;
          local_58._0_8_ = in_stack_fffffffffffffca8;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_58);
          this_00 = &((this->m_most_recent_block_txs)._M_t.
                      super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                     ._M_head_impl)->_M_t;
          if ((this_00 ==
               (_Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                *)0x0) ||
             (cVar16 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                       ::find(this_00,(key_type *)auStack_217),
             cVar16._M_node ==
             (_Base_ptr)
             ((long)&(((this->m_most_recent_block_txs)._M_t.
                       super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                      ._M_head_impl)->_M_t)._M_impl + 8U))) {
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
            this_02 = (_Base_ptr)0x0;
            pmVar21 = (mutex_type *)0x0;
          }
          else {
            pmVar21 = *(mutex_type **)(cVar16._M_node + 2);
            this_02 = cVar16._M_node[2]._M_parent;
            if (this_02 != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
              }
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
          }
        }
        else {
          this_02 = (_Base_ptr)criticalblock51.super_unique_lock._8_8_;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock51.super_unique_lock._M_owns = false;
          criticalblock51.super_unique_lock._9_7_ = 0;
        }
        if (criticalblock51.super_unique_lock._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     criticalblock51.super_unique_lock._8_8_);
        }
        if (pmVar21 == (mutex_type *)0x0) {
          if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CInv,std::allocator<CInv>>::_M_realloc_insert<CInv_const&>
                      ((vector<CInv,std::allocator<CInv>> *)&vNotFound,
                       (iterator)
                       vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                       super__Vector_impl_data._M_finish,(_Hash_node<Network,_false> *)paVar23);
          }
          else {
            *(undefined4 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0x1c) = *(undefined4 *)(paVar23 + 2);
            sVar7 = paVar23->_M_allocated_capacity;
            uVar8 = *(undefined8 *)((long)paVar23 + 8);
            uVar9 = *(undefined8 *)((long)paVar23 + 0x18);
            *(size_type *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0xc) = paVar23[1]._M_allocated_capacity;
            *(undefined8 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0x14) = uVar9;
            (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
             super__Vector_impl_data._M_finish)->type = (int)sVar7;
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[0] =
                 (char)(sVar7 >> 0x20);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[1] =
                 (char)(sVar7 >> 0x28);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[2] =
                 (char)(sVar7 >> 0x30);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[3] =
                 (char)(sVar7 >> 0x38);
            *(undefined8 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems + 4)
                 = uVar8;
            vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          maybe_with_witness.allow_witness = *(int *)paVar23 != 1;
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"tx","");
          criticalblock51.super_unique_lock._8_8_ = pmVar21;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)&maybe_with_witness;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((PeerManagerImpl *)this,pfrom,&local_258,
                     (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&criticalblock51);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          CTxMemPool::RemoveUnbroadcastTx
                    (this->m_mempool,
                     (uint256 *)((long)&pmVar21[1].super___mutex_base._M_mutex + 0x11),false);
        }
        if (this_02 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
      }
      paVar23 = paVar22;
    } while (paVar22 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur);
  }
  paVar23 = paVar22;
  pPVar32 = peer;
  if ((paVar22 ==
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) || (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0)
     ) goto LAB_001e0ce3;
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar22 + 0x24);
  if (paVar23 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hash) {
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ppCVar34[1];
    ppCVar34 = ppCVar34 + 1;
  }
  if ((2 < *(int *)paVar22 - 2U) && (*(int *)paVar22 != 0x40000002)) goto LAB_001e0ce3;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  criticalblock51.super_unique_lock._M_owns = false;
  criticalblock51.super_unique_lock._M_device = &(this->m_most_recent_block_mutex).super_mutex;
  pPVar33 = this;
  std::unique_lock<std::mutex>::lock(&criticalblock51.super_unique_lock);
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_most_recent_block).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->m_most_recent_block).
              super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_most_recent_compact_block).
       super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->m_most_recent_compact_block).
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock51.super_unique_lock);
  criticalblock51.super_unique_lock._0_9_ = ZEXT89(0xb43050);
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  hash = (_Elt_pointer)((long)paVar22 + 4);
  pCVar18 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,(uint256 *)hash);
  if ((pCVar18 == (CBlockIndex *)0x0) || (pCVar18->m_chain_tx_count == 0)) {
LAB_001e0f12:
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  }
  else {
    uVar3 = pCVar18->nStatus;
    if ((uVar3 & 0x60) == 0 && 4 < (uVar3 & 7)) goto LAB_001e0f12;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock51);
    if ((uVar3 & 0x60) == 0 && 1 < (uVar3 & 7)) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = &aStack_140;
      criticalblock51.super_unique_lock = (unique_lock)(auVar11 << 0x40);
      _local_148 = ZEXT89(0);
      auStack_130 = (undefined1  [8])(local_128 + 8);
      local_128._0_9_ = ZEXT89(0);
      pCVar20 = ChainstateManager::ActiveChainstate(this->m_chainman);
      local_2b8 = a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_2b0 = a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_2b8;
      bVar13 = Chainstate::ActivateBestChain
                         (pCVar20,(BlockValidationState *)&criticalblock51,pblock_00);
      if (local_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0);
      }
      if (!bVar13) {
        pLVar19 = LogInstance();
        bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
        if (bVar13) {
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    ((string *)&maybe_with_witness,
                     (ValidationState<BlockValidationResult> *)&criticalblock51);
          in_R8 = (long *)0x9a4;
          logging_function_05._M_str = "ProcessGetBlockData";
          logging_function_05._M_len = 0x13;
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_06._M_len = 0x5b;
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function_05,source_file_06,0x9a4,NET,Debug,
                     "failed to activate chain (%s)\n",(string *)&maybe_with_witness);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_208) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_208[0]._M_local_buf[7],
                                     CONCAT16(local_208[0]._M_local_buf[6],
                                              CONCAT24(local_208[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_208[0]._M_allocated_capacity))) + 1);
          }
        }
      }
      if (auStack_130 != (undefined1  [8])(local_128 + 8)) {
        operator_delete((void *)auStack_130,local_128._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)criticalblock51.super_unique_lock._8_8_ != &aStack_140) {
        operator_delete((void *)criticalblock51.super_unique_lock._8_8_,
                        (ulong)(aStack_140._M_allocated_capacity + 1));
      }
    }
  }
  block_pos.nFile = -1;
  block_pos.nPos = 0;
  criticalblock53.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock53.super_unique_lock._8_8_ =
       criticalblock53.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock53.super_unique_lock);
  pCVar18 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,(uint256 *)hash);
  if (pCVar18 == (CBlockIndex *)0x0) {
LAB_001e1095:
    uVar24 = 0;
    bVar13 = false;
    in_stack_fffffffffffffca8 = (CBlockIndex *)0x0;
  }
  else {
    bVar13 = BlockRequestAllowed(this,pCVar18);
    if (!bVar13) {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pfrom->id;
        pLVar19 = LogInstance();
        bVar13 = BCLog::Logger::Enabled(pLVar19);
        if (bVar13) {
          criticalblock51.super_unique_lock._8_8_ = 0;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_148;
          auVar10[0xf] = 0;
          auVar10._0_15_ = stack0xfffffffffffffeb9;
          _local_148 = auVar10 << 8;
          tinyformat::format<char[20],long>
                    ((string *)local_58,
                     (tinyformat *)
                     "%s: ignoring request from peer=%i for old block that isn\'t in the main chain\n"
                     ,"ProcessGetBlockData",(char (*) [20])&vInv,in_R8);
          _GLOBAL__N_1::PeerManagerImpl::ProcessGetData();
          pLVar19 = LogInstance();
          _maybe_with_witness = (TransactionSerParams *)0x5b;
          _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x811a20;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file._M_len = 0x5b;
          str._M_str = (char *)criticalblock51.super_unique_lock._M_device;
          str._M_len = criticalblock51.super_unique_lock._8_8_;
          logging_function_06._M_str = "ProcessGetBlockData";
          logging_function_06._M_len = 0x13;
          BCLog::Logger::LogPrintStr(pLVar19,str,logging_function_06,source_file,0x9b3,NET,Debug);
          if (criticalblock51.super_unique_lock._M_device != (mutex_type *)&local_148) {
            operator_delete(criticalblock51.super_unique_lock._M_device,(long)local_148 + 1);
          }
        }
      }
      goto LAB_001e1095;
    }
    bVar13 = CConnman::OutboundTargetReached(this->m_connman,true);
    if ((bVar13) &&
       ((((pCVar4 = this->m_chainman->m_best_header, pCVar4 != (CBlockIndex *)0x0 &&
          (0x93a80 < (long)((ulong)pCVar4->nTime - (ulong)pCVar18->nTime))) ||
         (*(int *)paVar22 == 3)) && ((pfrom->m_permission_flags & Download) == None)))) {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
        logging_function._M_str = "ProcessGetBlockData";
        logging_function._M_len = 0x13;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x5b;
        LogPrintf_<long>(logging_function,source_file_00,0x9bb,NET,Debug,
                         "historical block serving limit reached, disconnect peer=%d\n",
                         (long *)&criticalblock51);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
      goto LAB_001e1095;
    }
    pCVar20 = ChainstateManager::ActiveChainstate(this->m_chainman);
    ppCVar6 = (pCVar20->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 ==
        (pCVar20->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      in_stack_fffffffffffffca8 = (CBlockIndex *)0x0;
    }
    else {
      in_stack_fffffffffffffca8 = ppCVar6[-1];
    }
    if ((((~pfrom->m_permission_flags & 0x50) == 0) ||
        ((peer->m_our_services & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NETWORK_LIMITED)) ||
       (in_stack_fffffffffffffca8->nHeight - pCVar18->nHeight < 0x123)) {
      if ((pCVar18->nStatus & 8) == 0) goto LAB_001e14e1;
      bVar13 = CanDirectFetch(this);
      uVar24 = CONCAT71(extraout_var,bVar13) & 0xffffffff;
      block_pos.nFile = -(uint)((pCVar18->nStatus & 8) == 0) | pCVar18->nFile;
      block_pos.nPos = (int)(pCVar18->nStatus << 0x1c) >> 0x1f & pCVar18->nDataPos;
      bVar13 = true;
    }
    else {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
        logging_function_00._M_str = "ProcessGetBlockData";
        logging_function_00._M_len = 0x13;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x5b;
        LogPrintf_<long>(logging_function_00,source_file_01,0x9c4,NET,Debug,
                         "Ignore block request below NODE_NETWORK_LIMITED threshold, disconnect peer=%d\n"
                         ,(long *)&criticalblock51);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
LAB_001e14e1:
      uVar24 = 0;
      bVar13 = false;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock53.super_unique_lock);
  pPVar32 = peer;
  if (bVar13) {
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    in_stack_fffffffffffffce0 = (char)uVar24;
    in_stack_fffffffffffffce1 = (undefined7)(uVar24 >> 8);
    if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_001e1122:
      if (*(int *)paVar22 == 0x40000002) {
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar13 = ::node::BlockManager::ReadRawBlockFromDisk
                           (&this->m_chainman->m_blockman,&block_data,&block_pos);
        if (bVar13) {
          uStack_64 = 0x6b;
          criticalblock53.super_unique_lock._M_device =
               (mutex_type *)
               block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          criticalblock53.super_unique_lock._8_8_ =
               (long)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          this_01 = this->m_connman;
          local_208[0]._0_1_ = 'b';
          local_208[0]._1_1_ = 'l';
          local_208[0]._2_1_ = 'o';
          local_208[0]._3_1_ = 'c';
          local_208[0]._4_1_ = 'k';
          local_208[0]._5_1_ = '\0';
          local_208[0]._M_local_buf[6] = (undefined1)uStack_62;
          local_208[0]._M_local_buf[7] = (undefined1)((ushort)uStack_62 >> 8);
          local_208[0]._8_2_ = (undefined2)uStack_60;
          local_208[0]._M_local_buf[10] = (undefined1)((uint6)uStack_60 >> 0x10);
          local_208[0]._M_local_buf[0xb] = (undefined1)((uint6)uStack_60 >> 0x18);
          local_208[0]._12_2_ = (undefined2)((uint6)uStack_60 >> 0x20);
          local_208[0]._14_1_ = local_5a[0];
          local_208[0]._15_1_ = local_5a[1];
          _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
          local_78._8_8_ = (_Elt_pointer)0x0;
          local_78._16_4_ = 0x636f6c00;
          msg_type._M_string_length = (size_type)pfrom;
          msg_type._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
          msg_type.field_2._M_allocated_capacity = (size_type)peer;
          msg_type.field_2._8_8_ = pPVar33;
          _maybe_with_witness = (TransactionSerParams *)local_208;
          local_78._0_8_ = (_Elt_pointer)(local_78 + 0x10);
          NetMsg::Make<Span<unsigned_char>>
                    ((CSerializedNetMsg *)&criticalblock51,(NetMsg *)&maybe_with_witness,msg_type,
                     (Span<unsigned_char> *)&criticalblock53);
          CConnman::PushMessage(this_01,pfrom,(CSerializedNetMsg *)&criticalblock51);
          this = pPVar33;
          if ((undefined1 *)aStack_140._M_allocated_capacity != auStack_130) {
            operator_delete((void *)aStack_140._M_allocated_capacity,(long)auStack_130 + 1);
            this = pPVar33;
          }
          if (criticalblock51.super_unique_lock._M_device != (mutex_type *)0x0) {
            operator_delete(criticalblock51.super_unique_lock._M_device,
                            (long)local_148 - (long)criticalblock51.super_unique_lock._M_device);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_208) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_208[0]._M_local_buf[7],
                                     CONCAT16(local_208[0]._M_local_buf[6],
                                              CONCAT24(local_208[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_208[0]._M_allocated_capacity))) + 1);
          }
          pPVar32 = peer;
          pPVar33 = this;
          if ((_Elt_pointer)local_78._0_8_ != (_Elt_pointer)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            CONCAT26(uStack_62,CONCAT24(uStack_64,local_78._16_4_)) + 1);
          }
        }
        else {
          criticalblock51.super_unique_lock._0_9_ = ZEXT89(0xb43050);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          bVar14 = ::node::BlockManager::IsBlockPruned(&this->m_chainman->m_blockman,pCVar18);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          if (bVar14) {
            pLVar19 = LogInstance();
            bVar14 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
            pPVar32 = peer;
            if (bVar14) {
              criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
              logging_function_01._M_str = "ProcessGetBlockData";
              logging_function_01._M_len = 0x13;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_02._M_len = 0x5b;
              LogPrintf_<long>(logging_function_01,source_file_02,0x9db,NET,Debug,
                               "Block was pruned before it could be read, disconnect peer=%s\n",
                               (long *)&criticalblock51);
            }
          }
          else {
            criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            logging_function_03._M_str = "ProcessGetBlockData";
            logging_function_03._M_len = 0x13;
            source_file_04._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_04._M_len = 0x5b;
            LogPrintf_<long>(logging_function_03,source_file_04,0x9dd,ALL,Error,
                             "Cannot load block from disk, disconnect peer=%d\n",
                             (long *)&criticalblock51);
            pPVar32 = peer;
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        if (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(block_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)block_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)block_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        _maybe_with_witness = (TransactionSerParams *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<CBlock,std::allocator<CBlock>>
                  (&_Stack_210,(CBlock **)&maybe_with_witness,(allocator<CBlock> *)&criticalblock51)
        ;
        bVar13 = ::node::BlockManager::ReadBlockFromDisk
                           (&this->m_chainman->m_blockman,(CBlock *)_maybe_with_witness,&block_pos);
        if (bVar13) {
          pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_maybe_with_witness;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&_Stack_210);
          pPVar32 = peer;
        }
        else {
          criticalblock51.super_unique_lock._0_9_ = ZEXT89(0xb43050);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          bVar14 = ::node::BlockManager::IsBlockPruned(&this->m_chainman->m_blockman,pCVar18);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          if (bVar14) {
            pLVar19 = LogInstance();
            bVar14 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
            pPVar32 = peer;
            if (bVar14) {
              criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
              logging_function_02._M_str = "ProcessGetBlockData";
              logging_function_02._M_len = 0x13;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_03._M_len = 0x5b;
              LogPrintf_<long>(logging_function_02,source_file_03,0x9e9,NET,Debug,
                               "Block was pruned before it could be read, disconnect peer=%s\n",
                               (long *)&criticalblock51);
            }
          }
          else {
            criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            logging_function_04._M_str = "ProcessGetBlockData";
            logging_function_04._M_len = 0x13;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_05._M_len = 0x5b;
            LogPrintf_<long>(logging_function_04,source_file_05,0x9eb,ALL,Error,
                             "Cannot load block from disk, disconnect peer=%d\n",
                             (long *)&criticalblock51);
            pPVar32 = peer;
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        if ((element_type *)_Stack_210._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
        }
      }
      if (bVar13 != false) goto LAB_001e17b9;
    }
    else {
      CBlockHeader::GetHash
                ((uint256 *)&criticalblock51,
                 &(a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CBlockHeader);
      puVar5 = pCVar18->phashBlock;
      if (puVar5 == (uint256 *)0x0) goto LAB_001e1fef;
      auVar26[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0] ==
                    (uchar)criticalblock51.super_unique_lock._M_device);
      auVar26[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[1] ==
                    criticalblock51.super_unique_lock._M_device._1_1_);
      auVar26[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[2] ==
                    criticalblock51.super_unique_lock._M_device._2_1_);
      auVar26[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[3] ==
                    criticalblock51.super_unique_lock._M_device._3_1_);
      auVar26[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[4] ==
                    criticalblock51.super_unique_lock._M_device._4_1_);
      auVar26[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[5] ==
                    criticalblock51.super_unique_lock._M_device._5_1_);
      auVar26[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[6] ==
                    criticalblock51.super_unique_lock._M_device._6_1_);
      auVar26[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[7] ==
                    criticalblock51.super_unique_lock._M_device._7_1_);
      auVar26[8] = -((bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8] ==
                    criticalblock51.super_unique_lock._M_owns);
      auVar26[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[9] ==
                    criticalblock51.super_unique_lock._9_1_);
      auVar26[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[10] ==
                     criticalblock51.super_unique_lock._10_1_);
      auVar26[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      criticalblock51.super_unique_lock._11_1_);
      auVar26[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      criticalblock51.super_unique_lock._12_1_);
      auVar26[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      criticalblock51.super_unique_lock._13_1_);
      auVar26[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      criticalblock51.super_unique_lock._14_1_);
      auVar26[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      criticalblock51.super_unique_lock._15_1_);
      auVar29[0] = -(local_148._0_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x10]);
      auVar29[1] = -(local_148._1_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x11]);
      auVar29[2] = -(local_148._2_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x12]);
      auVar29[3] = -(local_148._3_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x13]);
      auVar29[4] = -(local_148._4_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x14]);
      auVar29[5] = -(local_148._5_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x15]);
      auVar29[6] = -(local_148._6_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x16]);
      auVar29[7] = -(local_148._7_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x17]);
      auVar29[8] = -(aStack_140._M_local_buf[0] ==
                    (puVar5->super_base_blob<256U>).m_data._M_elems[0x18]);
      auVar29[9] = -(aStack_140._M_local_buf[1] ==
                    (puVar5->super_base_blob<256U>).m_data._M_elems[0x19]);
      auVar29[10] = -(aStack_140._M_local_buf[2] ==
                     (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a]);
      auVar29[0xb] = -(aStack_140._M_local_buf[3] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b]);
      auVar29[0xc] = -(aStack_140._M_local_buf[4] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c]);
      auVar29[0xd] = -(aStack_140._M_local_buf[5] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d]);
      auVar29[0xe] = -(aStack_140._M_local_buf[6] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e]);
      auVar29[0xf] = -(aStack_140._M_local_buf[7] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f]);
      auVar26 = auVar26 & auVar29;
      if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001e1122;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pPVar32 = peer;
LAB_001e17b9:
      if (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        iVar2 = *(int *)paVar22;
        if (iVar2 < 4) {
          if (iVar2 == 2) {
            local_148._0_6_ = 0x6b636f6c62;
            criticalblock51.super_unique_lock._8_8_ = 5;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_148;
            _maybe_with_witness = &::TX_NO_WITNESS;
            _Stack_210._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                       (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
            goto LAB_001e1af3;
          }
          if (iVar2 == 3) {
            local_118 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            stack0xfffffffffffffec8 = (undefined1  [16])0x0;
            _local_148 = (undefined1  [16])0x0;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)0x0;
            criticalblock51.super_unique_lock._M_owns = false;
            criticalblock51.super_unique_lock._9_7_ = 0;
            CPartialMerkleTree::CPartialMerkleTree(&local_108);
            local_b8 = (undefined1  [16])0x0;
            local_a8 = (pointer)0x0;
            pTVar15 = Peer::GetTxRelay(peer);
            peer = pPVar32;
            if (pTVar15 != (TxRelay *)0x0) {
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pTVar15;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)&block_data);
              if ((pTVar15->m_bloom_filter)._M_t.
                  super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>._M_t.
                  super__Tuple_impl<0UL,_CBloomFilter_*,_std::default_delete<CBloomFilter>_>.
                  super__Head_base<0UL,_CBloomFilter_*,_false>._M_head_impl == (CBloomFilter *)0x0)
              {
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)&block_data);
                peer = pPVar32;
              }
              else {
                CMerkleBlock::CMerkleBlock
                          ((CMerkleBlock *)&maybe_with_witness,
                           pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(pTVar15->m_bloom_filter)._M_t.
                                  super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_CBloomFilter_*,_std::default_delete<CBloomFilter>_>
                                  .super__Head_base<0UL,_CBloomFilter_*,_false>._M_head_impl,
                           (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            *)0x0);
                CMerkleBlock::operator=
                          ((CMerkleBlock *)&criticalblock51,(CMerkleBlock *)&maybe_with_witness);
                CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&maybe_with_witness);
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)&block_data);
                local_208[0]._0_1_ = 'm';
                local_208[0]._1_1_ = 'e';
                local_208[0]._2_1_ = 'r';
                local_208[0]._3_1_ = 'k';
                local_208[0]._4_1_ = 'l';
                local_208[0]._5_1_ = 'e';
                local_208[0]._M_local_buf[6] = 'b';
                local_208[0]._M_local_buf[7] = 'l';
                local_208[0]._8_1_ = 'o';
                local_208[0]._9_1_ = 'c';
                local_208[0]._M_local_buf[10] = 'k';
                _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                local_208[0]._M_local_buf[0xb] = '\0';
                _maybe_with_witness = (TransactionSerParams *)local_208;
                (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CMerkleBlock&>
                          ((PeerManagerImpl *)this,pfrom,(string *)&maybe_with_witness,
                           (CMerkleBlock *)&criticalblock51);
                peer = pPVar32;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_maybe_with_witness != local_208) {
                  operator_delete(_maybe_with_witness,
                                  CONCAT17(local_208[0]._M_local_buf[7],
                                           CONCAT16(local_208[0]._M_local_buf[6],
                                                    CONCAT24(local_208[0]._M_allocated_capacity.
                                                             _4_2_,(undefined4)
                                                                   local_208[0].
                                                                   _M_allocated_capacity))) + 1);
                  peer = pPVar32;
                }
                uVar8 = local_b8._8_8_;
                if (local_b8._0_8_ != local_b8._8_8_) {
                  ppuVar1 = &block_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                  ppVar25 = (pointer)local_b8._0_8_;
                  do {
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT53(block_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_5_,
                                           0x7874);
                    criticalblock53.super_unique_lock._8_8_ =
                         ((pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[ppVar25->first].
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    criticalblock53.super_unique_lock._M_device = (mutex_type *)&::TX_NO_WITNESS;
                    (anonymous_namespace)::PeerManagerImpl::
                    MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                              ((PeerManagerImpl *)this,pfrom,(string *)&block_data,
                               (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)
                               &criticalblock53);
                    if ((pointer *)
                        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start != ppuVar1) {
                      operator_delete(block_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (ulong)(block_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                             ));
                    }
                    ppVar25 = ppVar25 + 1;
                  } while (ppVar25 != (pointer)uVar8);
                }
              }
            }
            CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&criticalblock51);
            pPVar32 = peer;
          }
        }
        else if (iVar2 == 4) {
          if ((in_stack_fffffffffffffce0 == '\0') ||
             (pCVar18->nHeight < in_stack_fffffffffffffca8->nHeight + -5)) {
            local_148._0_6_ = 0x6b636f6c62;
            criticalblock51.super_unique_lock._8_8_ = 5;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_148;
            _maybe_with_witness = &::TX_WITH_WITNESS;
            _Stack_210._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                       (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
            goto LAB_001e1af3;
          }
          if (a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            CBlockHeader::GetHash
                      ((uint256 *)&criticalblock51,
                       &(a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->header);
            auVar11 = _local_148;
            puVar5 = pCVar18->phashBlock;
            if (puVar5 == (uint256 *)0x0) goto LAB_001e1fef;
            auVar27[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0] ==
                          (uchar)criticalblock51.super_unique_lock._M_device);
            auVar27[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[1] ==
                          criticalblock51.super_unique_lock._M_device._1_1_);
            auVar27[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[2] ==
                          criticalblock51.super_unique_lock._M_device._2_1_);
            auVar27[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[3] ==
                          criticalblock51.super_unique_lock._M_device._3_1_);
            auVar27[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[4] ==
                          criticalblock51.super_unique_lock._M_device._4_1_);
            auVar27[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[5] ==
                          criticalblock51.super_unique_lock._M_device._5_1_);
            auVar27[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[6] ==
                          criticalblock51.super_unique_lock._M_device._6_1_);
            auVar27[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[7] ==
                          criticalblock51.super_unique_lock._M_device._7_1_);
            auVar27[8] = -((bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8] ==
                          criticalblock51.super_unique_lock._M_owns);
            auVar27[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[9] ==
                          criticalblock51.super_unique_lock._9_1_);
            auVar27[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[10] ==
                           criticalblock51.super_unique_lock._10_1_);
            auVar27[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xb] ==
                            criticalblock51.super_unique_lock._11_1_);
            auVar27[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xc] ==
                            criticalblock51.super_unique_lock._12_1_);
            auVar27[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xd] ==
                            criticalblock51.super_unique_lock._13_1_);
            auVar27[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xe] ==
                            criticalblock51.super_unique_lock._14_1_);
            auVar27[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xf] ==
                            criticalblock51.super_unique_lock._15_1_);
            auVar30[0] = -(local_148._0_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x10])
            ;
            auVar30[1] = -(local_148._1_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x11])
            ;
            auVar30[2] = -(local_148._2_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x12])
            ;
            auVar30[3] = -(local_148._3_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x13])
            ;
            auVar30[4] = -(local_148._4_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x14])
            ;
            auVar30[5] = -(local_148._5_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x15])
            ;
            auVar30[6] = -(local_148._6_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x16])
            ;
            auVar30[7] = -(local_148._7_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x17])
            ;
            auVar30[8] = -(aStack_140._M_local_buf[0] ==
                          (puVar5->super_base_blob<256U>).m_data._M_elems[0x18]);
            auVar30[9] = -(aStack_140._M_local_buf[1] ==
                          (puVar5->super_base_blob<256U>).m_data._M_elems[0x19]);
            auVar30[10] = -(aStack_140._M_local_buf[2] ==
                           (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a]);
            auVar30[0xb] = -(aStack_140._M_local_buf[3] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b]);
            auVar30[0xc] = -(aStack_140._M_local_buf[4] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c]);
            auVar30[0xd] = -(aStack_140._M_local_buf[5] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d]);
            auVar30[0xe] = -(aStack_140._M_local_buf[6] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e]);
            auVar30[0xf] = -(aStack_140._M_local_buf[7] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f]);
            auVar27 = auVar27 & auVar30;
            if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
              aStack_140._M_allocated_capacity._0_2_ = 0x6b63;
              local_148 = (CInv *)0x6f6c627463706d63;
              criticalblock51.super_unique_lock._8_8_ = 10;
              criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_148;
              aStack_140._M_allocated_capacity._3_5_ = auVar11._11_5_;
              aStack_140._M_local_buf[2] = 0;
              (anonymous_namespace)::PeerManagerImpl::
              MakeAndPushMessage<CBlockHeaderAndShortTxIDs_const&>
                        ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                         a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              goto LAB_001e1af3;
            }
          }
          block = pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nonce = FastRandomContext::rand64(&this->m_rng);
          CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&criticalblock51,block,nonce);
          local_208[0]._0_1_ = 'c';
          local_208[0]._1_1_ = 'm';
          local_208[0]._2_1_ = 'p';
          local_208[0]._3_1_ = 'c';
          local_208[0]._4_1_ = 't';
          local_208[0]._5_1_ = 'b';
          local_208[0]._M_local_buf[6] = 'l';
          local_208[0]._M_local_buf[7] = 'o';
          local_208[0]._8_1_ = 'c';
          local_208[0]._9_1_ = 'k';
          _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
          local_208[0]._M_local_buf[10] = '\0';
          _maybe_with_witness = (TransactionSerParams *)local_208;
          (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CBlockHeaderAndShortTxIDs&>
                    ((PeerManagerImpl *)this,pfrom,(string *)&maybe_with_witness,
                     (CBlockHeaderAndShortTxIDs *)&criticalblock51);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_208) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_208[0]._M_local_buf[7],
                                     CONCAT16(local_208[0]._M_local_buf[6],
                                              CONCAT24(local_208[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_208[0]._M_allocated_capacity))) + 1);
          }
          CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&criticalblock51);
        }
        else if (iVar2 == 0x40000002) {
          local_148._0_6_ = 0x6b636f6c62;
          criticalblock51.super_unique_lock._8_8_ = 5;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_148;
          _maybe_with_witness = &::TX_WITH_WITNESS;
          _Stack_210._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                     (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
LAB_001e1af3:
          if (criticalblock51.super_unique_lock._M_device != (mutex_type *)&local_148) {
            operator_delete(criticalblock51.super_unique_lock._M_device,(long)local_148 + 1);
          }
        }
      }
      criticalblock57.super_unique_lock._M_device = &(peer->m_block_inv_mutex).super_mutex;
      criticalblock57.super_unique_lock._M_owns = false;
      std::unique_lock<std::mutex>::lock(&criticalblock57.super_unique_lock);
      auVar31[0] = -((__int_type_conflict)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0] ==
                    ((__atomic_base<bool> *)&hash->type)->_M_i);
      auVar31[1] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[1] ==
                    ((__atomic_base<bool> *)&hash->type)[1]._M_i);
      auVar31[2] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[2] ==
                    ((__atomic_base<bool> *)&hash->type)[2]._M_i);
      auVar31[3] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[3] ==
                    ((__atomic_base<bool> *)&hash->type)[3]._M_i);
      auVar31[4] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[4] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0]);
      auVar31[5] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[5] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[1]);
      auVar31[6] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[6] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[2]);
      auVar31[7] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[7] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[3]);
      auVar31[8] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[8] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[4]);
      auVar31[9] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[9] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[5]);
      auVar31[10] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[10] ==
                     (hash->hash).super_base_blob<256U>.m_data._M_elems[6]);
      auVar31[0xb] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xb] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[7]);
      auVar31[0xc] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xc] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[8]);
      auVar31[0xd] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xd] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[9]);
      auVar31[0xe] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xe] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[10]);
      auVar31[0xf] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xf] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar28[0] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x10] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar28[1] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x11] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar28[2] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x12] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar28[3] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x13] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar28[4] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x14] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar28[5] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x15] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar28[6] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x16] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar28[7] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x17] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar28[8] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x18] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar28[9] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x19] ==
                    (hash->hash).super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar28[10] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     (hash->hash).super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar28[0xb] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar28[0xc] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar28[0xd] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar28[0xe] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar28[0xf] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      (hash->hash).super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar28 = auVar28 & auVar31;
      if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_2fc = MSG_BLOCK;
        puVar5 = in_stack_fffffffffffffca8->phashBlock;
        if (puVar5 == (uint256 *)0x0) {
LAB_001e1fef:
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        criticalblock53.super_unique_lock._M_device =
             *(mutex_type **)(puVar5->super_base_blob<256U>).m_data._M_elems;
        pbVar12 = &puVar5->super_base_blob<256U>;
        criticalblock53.super_unique_lock._M_owns = (bool)(pbVar12->m_data)._M_elems[8];
        criticalblock53.super_unique_lock._9_1_ = (pbVar12->m_data)._M_elems[9];
        criticalblock53.super_unique_lock._10_1_ = (pbVar12->m_data)._M_elems[10];
        criticalblock53.super_unique_lock._11_1_ = (pbVar12->m_data)._M_elems[0xb];
        criticalblock53.super_unique_lock._12_1_ = (pbVar12->m_data)._M_elems[0xc];
        criticalblock53.super_unique_lock._13_1_ = (pbVar12->m_data)._M_elems[0xd];
        criticalblock53.super_unique_lock._14_1_ = (pbVar12->m_data)._M_elems[0xe];
        criticalblock53.super_unique_lock._15_1_ = (pbVar12->m_data)._M_elems[0xf];
        local_228._0_8_ = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
        local_228._8_8_ = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
        std::vector<CInv,std::allocator<CInv>>::emplace_back<GetDataMsg,uint256>
                  ((vector<CInv,std::allocator<CInv>> *)&vInv,&local_2fc,(uint256 *)&criticalblock53
                  );
        local_228._0_4_ = 0x766e69;
        criticalblock53.super_unique_lock._M_owns = true;
        criticalblock53.super_unique_lock._9_7_ = 0;
        criticalblock53.super_unique_lock._M_device = (mutex_type *)local_228;
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                  ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock53,&vInv);
        puVar5 = &peer->m_continuation_block;
        if (criticalblock53.super_unique_lock._M_device != (mutex_type *)local_228) {
          operator_delete(criticalblock53.super_unique_lock._M_device,local_228._0_8_ + 1);
        }
        pbVar12 = &(peer->m_continuation_block).super_base_blob<256U>;
        (pbVar12->m_data)._M_elems[0x10] = '\0';
        (pbVar12->m_data)._M_elems[0x11] = '\0';
        (pbVar12->m_data)._M_elems[0x12] = '\0';
        (pbVar12->m_data)._M_elems[0x13] = '\0';
        (pbVar12->m_data)._M_elems[0x14] = '\0';
        (pbVar12->m_data)._M_elems[0x15] = '\0';
        (pbVar12->m_data)._M_elems[0x16] = '\0';
        (pbVar12->m_data)._M_elems[0x17] = '\0';
        (pbVar12->m_data)._M_elems[0x18] = '\0';
        (pbVar12->m_data)._M_elems[0x19] = '\0';
        (pbVar12->m_data)._M_elems[0x1a] = '\0';
        (pbVar12->m_data)._M_elems[0x1b] = '\0';
        (pbVar12->m_data)._M_elems[0x1c] = '\0';
        (pbVar12->m_data)._M_elems[0x1d] = '\0';
        (pbVar12->m_data)._M_elems[0x1e] = '\0';
        (pbVar12->m_data)._M_elems[0x1f] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[1] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[2] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[3] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[4] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[5] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[6] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[7] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[8] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[9] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[10] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
        (puVar5->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
        if (vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock57.super_unique_lock);
    }
    if (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  peer = pPVar32;
  this = pPVar33;
  if (a_recent_compact_block.
      super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (a_recent_compact_block.
               super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    peer = pPVar32;
    this = pPVar33;
  }
  pPVar32 = peer;
  interruptMsgProc = (atomic<bool> *)paVar23;
  if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_001e0ce3:
  aStack_140._M_allocated_capacity =
       (size_type)
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  criticalblock51.super_unique_lock._8_8_ = *(undefined8 *)aStack_140._M_allocated_capacity;
  criticalblock51.super_unique_lock._M_device =
       (mutex_type *)
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_148 = (CInv *)(criticalblock51.super_unique_lock._8_8_ + 0x1f8);
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppCVar34;
  puVar17 = (((element_type *)((long)_Stack_210._M_pi + 0x1c0))->super_CBlockHeader).hashMerkleRoot.
            super_base_blob<256U>.m_data._M_elems + 0x14;
  local_208[0]._M_allocated_capacity._0_4_ = SUB84(puVar17,0);
  local_208[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)puVar17 >> 0x20);
  local_208[0]._M_local_buf[6] = (undefined1)((ulong)puVar17 >> 0x30);
  local_208[0]._M_local_buf[7] = (undefined1)((ulong)puVar17 >> 0x38);
  local_208[0]._8_2_ = SUB82(ppCVar34,0);
  local_208[0]._M_local_buf[10] = (undefined1)((ulong)ppCVar34 >> 0x10);
  local_208[0]._M_local_buf[0xb] = (undefined1)((ulong)ppCVar34 >> 0x18);
  local_208[0]._12_2_ = (undefined2)((ulong)ppCVar34 >> 0x20);
  local_208[0]._14_2_ = (undefined2)((ulong)ppCVar34 >> 0x30);
  __first._M_first = (_Elt_pointer)pfrom;
  __first._M_cur = (_Elt_pointer)in_stack_fffffffffffffca8;
  __first._M_last = (_Elt_pointer)pPVar32;
  __first._M_node = (_Map_pointer)this;
  __last._M_first = (_Elt_pointer)ppCVar34;
  __last._M_cur = hash;
  __last._M_last = (_Elt_pointer)interruptMsgProc;
  __last._M_node._0_1_ = in_stack_fffffffffffffce0;
  __last._M_node._1_7_ = in_stack_fffffffffffffce1;
  _maybe_with_witness = (TransactionSerParams *)paVar23;
  std::deque<CInv,_std::allocator<CInv>_>::_M_erase
            ((iterator *)local_78,&peer->m_getdata_requests,__first,__last);
  if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"notfound","");
    (anonymous_namespace)::PeerManagerImpl::
    MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
              ((PeerManagerImpl *)this,pfrom,&local_278,&vNotFound);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001e0db5:
  if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetData(CNode& pfrom, Peer& peer, const std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(cs_main);

    auto tx_relay = peer.GetTxRelay();

    std::deque<CInv>::iterator it = peer.m_getdata_requests.begin();
    std::vector<CInv> vNotFound;

    // Process as many TX items from the front of the getdata queue as
    // possible, since they're common and it's efficient to batch process
    // them.
    while (it != peer.m_getdata_requests.end() && it->IsGenTxMsg()) {
        if (interruptMsgProc) return;
        // The send buffer provides backpressure. If there's no space in
        // the buffer, pause processing until the next call.
        if (pfrom.fPauseSend) break;

        const CInv &inv = *it++;

        if (tx_relay == nullptr) {
            // Ignore GETDATA requests for transactions from block-relay-only
            // peers and peers that asked us not to announce transactions.
            continue;
        }

        CTransactionRef tx = FindTxForGetData(*tx_relay, ToGenTxid(inv));
        if (tx) {
            // WTX and WITNESS_TX imply we serialize with witness
            const auto maybe_with_witness = (inv.IsMsgTx() ? TX_NO_WITNESS : TX_WITH_WITNESS);
            MakeAndPushMessage(pfrom, NetMsgType::TX, maybe_with_witness(*tx));
            m_mempool.RemoveUnbroadcastTx(tx->GetHash());
        } else {
            vNotFound.push_back(inv);
        }
    }

    // Only process one BLOCK item per call, since they're uncommon and can be
    // expensive to process.
    if (it != peer.m_getdata_requests.end() && !pfrom.fPauseSend) {
        const CInv &inv = *it++;
        if (inv.IsGenBlkMsg()) {
            ProcessGetBlockData(pfrom, peer, inv);
        }
        // else: If the first item on the queue is an unknown type, we erase it
        // and continue processing the queue on the next call.
    }

    peer.m_getdata_requests.erase(peer.m_getdata_requests.begin(), it);

    if (!vNotFound.empty()) {
        // Let the peer know that we didn't find what it asked for, so it doesn't
        // have to wait around forever.
        // SPV clients care about this message: it's needed when they are
        // recursively walking the dependencies of relevant unconfirmed
        // transactions. SPV clients want to do that because they want to know
        // about (and store and rebroadcast and risk analyze) the dependencies
        // of transactions relevant to them, without having to download the
        // entire memory pool.
        // Also, other nodes can use these messages to automatically request a
        // transaction from some other peer that announced it, and stop
        // waiting for us to respond.
        // In normal operation, we often send NOTFOUND messages for parents of
        // transactions that we relay; if a peer is missing a parent, they may
        // assume we have them and request the parents from us.
        MakeAndPushMessage(pfrom, NetMsgType::NOTFOUND, vNotFound);
    }
}